

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

CallInst * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::CallInst,LLVMBC::FunctionType*&,LLVMBC::Function*&,std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>>
          (LLVMContext *this,FunctionType **u,Function **u_1,
          vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *u_2)

{
  Function *function_type_;
  Function *callee_;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_50;
  CallInst *local_38;
  CallInst *t;
  CallInst *mem;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *u_local_2;
  Function **u_local_1;
  FunctionType **u_local;
  LLVMContext *this_local;
  
  mem = (CallInst *)u_2;
  u_local_2 = (vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)u_1;
  u_local_1 = (Function **)u;
  u_local = (FunctionType **)this;
  local_38 = (CallInst *)allocate(this,0x78,8);
  t = local_38;
  if (local_38 == (CallInst *)0x0) {
    std::terminate();
  }
  function_type_ = *u_local_1;
  callee_ = (Function *)
            (u_local_2->
            super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_50,
             (vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)mem);
  CallInst::CallInst(local_38,(FunctionType *)function_type_,callee_,&local_50);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector(&local_50)
  ;
  append_typed_destructor<LLVMBC::CallInst>(this,local_38);
  return local_38;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}